

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdGetTapBranchData(void *handle,void *tree_handle,uint8_t index_from_leaf,bool is_root_data,
                       char **branch_hash,uint8_t *leaf_version,char **tapscript,
                       uint8_t *depth_by_leaf_or_end)

{
  bool bVar1;
  uint8_t uVar2;
  size_type sVar3;
  undefined8 uVar4;
  reference object;
  byte in_CL;
  byte in_DL;
  long in_RSI;
  undefined8 *in_R8;
  uint8_t *in_R9;
  undefined8 *in_stack_00000008;
  undefined1 *in_stack_00000010;
  CfdException *except;
  exception *std_except;
  uint32_t max;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> branches;
  uint8_t branch_count;
  bool has_leaf;
  TapBranch branch_data;
  ByteData256 hash_obj;
  TapBranch *branch;
  CfdCapiTapscriptTree *buffer;
  char *work_branch_hash;
  char *work_tapscript;
  int result;
  size_type in_stack_fffffffffffffd38;
  TapBranch *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffd60;
  string *message;
  string local_248;
  Script local_228;
  string local_1f0;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_1d0;
  string *in_stack_fffffffffffffe48;
  pointer in_stack_fffffffffffffe50;
  ByteData256 local_1a0;
  undefined1 local_182;
  allocator local_181;
  string local_180 [32];
  CfdSourceLocation local_160;
  uint local_144;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_140;
  undefined1 local_122;
  byte local_121;
  TapBranch local_120;
  ByteData256 local_a8;
  reference local_90;
  long local_88;
  undefined1 local_79 [49];
  string *local_48;
  char *local_40;
  undefined4 local_34;
  uint8_t *local_30;
  undefined8 *local_28;
  byte local_1a;
  byte local_19;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  local_1a = in_CL & 1;
  local_34 = 0xffffffff;
  local_40 = (char *)0x0;
  local_48 = (string *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_19 = in_DL;
  local_18 = in_RSI;
  cfd::Initialize();
  message = (string *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_79 + 1),"TapscriptTree",(allocator *)message);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  local_88 = local_18;
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_18 + 0x18));
  if (bVar1) {
    local_90 = std::
               vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
               at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                   *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  else {
    local_90 = (reference)
               std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                         ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                          in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  cfd::core::ByteData256::ByteData256(&local_a8);
  cfd::core::TapBranch::TapBranch(&local_120);
  local_121 = 0;
  local_122 = 0;
  cfd::core::TapBranch::GetBranchList(&local_140,&local_90->super_TapBranch);
  sVar3 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size(&local_140)
  ;
  local_144 = (uint)sVar3;
  if (local_144 <= local_19) {
    local_160.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    local_160.filename = local_160.filename + 1;
    local_160.line = 0x3a0;
    local_160.funcname = "CfdGetTapBranchData";
    cfd::core::logger::warn<>(&local_160,"index_from_leaf is out of range.");
    local_182 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_180,"Failed to parameter. index_from_leaf is out of range.",&local_181);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd60,error_code,in_stack_fffffffffffffd50);
    local_182 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_1a & 1) == 0) {
    object = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                       ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                        in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    cfd::core::TapBranch::operator=(&local_120,object);
    cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&stack0xfffffffffffffe48,&local_120);
    cfd::core::ByteData256::operator=(&local_a8,(ByteData256 *)&stack0xfffffffffffffe48);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x59cf14);
    local_121 = cfd::core::TapBranch::HasTapLeaf(&local_120);
    cfd::core::TapBranch::GetBranchList(&local_1d0,&local_120);
    sVar3 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                      (&local_1d0);
    local_122 = (undefined1)sVar3;
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
               in_stack_fffffffffffffd50);
  }
  else {
    cfd::core::TapBranch::GetBranchHash(&local_1a0,&local_90->super_TapBranch,local_19);
    cfd::core::ByteData256::operator=(&local_a8,&local_1a0);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x59cea2);
  }
  if (((local_121 & 1) != 0) && (in_stack_00000008 != (undefined8 *)0x0)) {
    cfd::core::TapBranch::GetScript(&local_228,&local_120);
    cfd::core::Script::GetHex_abi_cxx11_(&local_1f0,&local_228);
    local_40 = cfd::capi::CreateString(message);
    std::__cxx11::string::~string((string *)&local_1f0);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffffd40);
  }
  if (local_28 != (undefined8 *)0x0) {
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_248,&local_a8);
    in_stack_fffffffffffffd50 = (string *)cfd::capi::CreateString(message);
    local_48 = in_stack_fffffffffffffd50;
    std::__cxx11::string::~string((string *)&local_248);
  }
  if (local_30 != (uint8_t *)0x0) {
    if ((local_121 & 1) == 0) {
      uVar2 = '\0';
    }
    else {
      uVar2 = cfd::core::TapBranch::GetLeafVersion(&local_120);
    }
    *local_30 = uVar2;
  }
  if (in_stack_00000010 != (undefined1 *)0x0) {
    *in_stack_00000010 = local_122;
  }
  if (in_stack_00000008 != (undefined8 *)0x0) {
    *in_stack_00000008 = local_40;
  }
  if (local_28 != (undefined8 *)0x0) {
    *local_28 = local_48;
  }
  local_4 = 0;
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
             in_stack_fffffffffffffd50);
  cfd::core::TapBranch::~TapBranch(in_stack_fffffffffffffd40);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x59d18c);
  return local_4;
}

Assistant:

int CfdGetTapBranchData(
    void* handle, void* tree_handle, uint8_t index_from_leaf,
    bool is_root_data, char** branch_hash, uint8_t* leaf_version,
    char** tapscript, uint8_t* depth_by_leaf_or_end) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_tapscript = nullptr;
  char* work_branch_hash = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    TapBranch* branch;
    if (!buffer->branch_buffer->empty()) {
      branch = &buffer->branch_buffer->at(0);
    } else {
      branch = &buffer->tree_buffer->at(0);
    }

    ByteData256 hash_obj;
    TapBranch branch_data;
    bool has_leaf = false;
    uint8_t branch_count = 0;
    auto branches = branch->GetBranchList();
    uint32_t max = static_cast<uint32_t>(branches.size());
    if (max <= index_from_leaf) {
      warn(CFD_LOG_SOURCE, "index_from_leaf is out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index_from_leaf is out of range.");
    }
    if (is_root_data) {
      hash_obj = branch->GetBranchHash(index_from_leaf);
    } else {
      branch_data = branches.at(index_from_leaf);
      hash_obj = branch_data.GetCurrentBranchHash();
      has_leaf = branch_data.HasTapLeaf();
      branch_count = static_cast<uint8_t>(branch_data.GetBranchList().size());
    }

    if (has_leaf && (tapscript != nullptr)) {
      work_tapscript = CreateString(branch_data.GetScript().GetHex());
    }
    if (branch_hash != nullptr) {
      work_branch_hash = CreateString(hash_obj.GetHex());
    }

    if (leaf_version != nullptr) {
      *leaf_version = (has_leaf) ? branch_data.GetLeafVersion() : 0;
    }
    if (depth_by_leaf_or_end != nullptr) *depth_by_leaf_or_end = branch_count;
    if (tapscript != nullptr) *tapscript = work_tapscript;
    if (branch_hash != nullptr) *branch_hash = work_branch_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_tapscript, &work_branch_hash);
  return result;
}